

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

void __thiscall Gluco::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  int iVar1;
  int iVar2;
  vec<unsigned_int> *this_00;
  uint *puVar3;
  int local_2c;
  int j;
  vec<unsigned_int> *cs;
  ClauseAllocator *pCStack_18;
  int i;
  ClauseAllocator *to_local;
  SimpSolver *this_local;
  
  if ((this->use_simplification & 1U) != 0) {
    pCStack_18 = to;
    to_local = (ClauseAllocator *)this;
    for (cs._4_4_ = 0; iVar2 = cs._4_4_, iVar1 = Solver::nVars(&this->super_Solver), iVar2 < iVar1;
        cs._4_4_ = cs._4_4_ + 1) {
      this_00 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::
                operator[](&this->occurs,(int *)((long)&cs + 4));
      for (local_2c = 0; iVar2 = vec<unsigned_int>::size(this_00), local_2c < iVar2;
          local_2c = local_2c + 1) {
        puVar3 = vec<unsigned_int>::operator[](this_00,local_2c);
        ClauseAllocator::reloc(&(this->super_Solver).ca,puVar3,pCStack_18);
      }
    }
    for (cs._4_4_ = 0; iVar2 = cs._4_4_, iVar1 = Queue<unsigned_int>::size(&this->subsumption_queue)
        , iVar2 < iVar1; cs._4_4_ = cs._4_4_ + 1) {
      puVar3 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
      ClauseAllocator::reloc(&(this->super_Solver).ca,puVar3,pCStack_18);
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,pCStack_18);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    int i;
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (i = 0; i < nVars(); i++){
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (i = 0; i < subsumption_queue.size(); i++)
        ca.reloc(subsumption_queue[i], to);

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}